

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall Rml::DataViewRml::Update(DataViewRml *this,DataModel *model)

{
  bool bVar1;
  Element *element;
  DataExpression *this_00;
  String new_rml;
  Variant variant;
  DataExpressionInterface expr_interface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Variant local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  DataExpressionInterface local_38;
  
  Variant::Variant(&local_80);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_38,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar1 = DataExpression::Run(this_00,&local_38,&local_80);
    if (bVar1) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      Variant::Get<std::__cxx11::string>(&local_a0,&local_80,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      bVar1 = ::std::operator!=(&local_a0,&this->previous_rml);
      if (bVar1) {
        Element::SetInnerRML(element,&local_a0);
        ::std::__cxx11::string::operator=((string *)&this->previous_rml,(string *)&local_a0);
      }
      ::std::__cxx11::string::~string((string *)&local_a0);
      goto LAB_0026edeb;
    }
  }
  bVar1 = false;
LAB_0026edeb:
  Variant::~Variant(&local_80);
  return bVar1;
}

Assistant:

bool DataViewRml::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		String new_rml = variant.Get<String>();
		if (new_rml != previous_rml)
		{
			element->SetInnerRML(new_rml);
			previous_rml = std::move(new_rml);
			result = true;
		}
	}
	return result;
}